

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMouseViewportEvent(ImGuiIO *this,ImGuiID viewport_id)

{
  undefined1 local_38 [8];
  ImGuiInputEvent e;
  ImGuiContext *g;
  ImGuiID viewport_id_local;
  ImGuiIO *this_local;
  
  e._16_8_ = GImGui;
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x589,"void ImGuiIO::AddMouseViewportEvent(ImGuiID)");
  }
  if (((GImGui->IO).BackendFlags & 0x800U) == 0) {
    __assert_fail("g.IO.BackendFlags & ImGuiBackendFlags_HasMouseHoveredViewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x58a,"void ImGuiIO::AddMouseViewportEvent(ImGuiID)");
  }
  ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)local_38);
  local_38._0_4_ = ImGuiInputEventType_MouseViewport;
  local_38._4_4_ = ImGuiInputSource_Mouse;
  e.Type = viewport_id;
  ImVector<ImGuiInputEvent>::push_back
            ((ImVector<ImGuiInputEvent> *)(e._16_8_ + 0x38e8),(ImGuiInputEvent *)local_38);
  return;
}

Assistant:

void ImGuiIO::AddMouseViewportEvent(ImGuiID viewport_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(g.IO.BackendFlags & ImGuiBackendFlags_HasMouseHoveredViewport);

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseViewport;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseViewport.HoveredViewportID = viewport_id;
    g.InputEventsQueue.push_back(e);
}